

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_199c2b::MissingCommandTask::inputsAvailable
          (MissingCommandTask *this,TaskInterface ti)

{
  ValueType local_b0;
  TaskInterface local_98;
  BuildValue local_88;
  
  local_98.ctx = ti.ctx;
  local_98.impl = ti.impl;
  local_88.stringValues.contents = (char *)0x0;
  local_88.stringValues.size = 0;
  local_88.valueData._64_8_ = 0;
  local_88.valueData._72_8_ = 0;
  local_88.valueData._48_8_ = 0;
  local_88.valueData._56_8_ = 0;
  local_88.valueData.asOutputInfo.modTime.seconds = 0;
  local_88.valueData.asOutputInfo.modTime.nanoseconds = 0;
  local_88.valueData.asOutputInfo.mode = 0;
  local_88.valueData.asOutputInfo.size = 0;
  local_88.valueData.asOutputInfo.device = 0;
  local_88.valueData.asOutputInfo.inode = 0;
  local_88.kind = Invalid;
  local_88.numOutputInfos = 0;
  local_88.signature.value = 0;
  llbuild::buildsystem::BuildValue::toData(&local_b0,&local_88);
  llbuild::core::TaskInterface::complete(&local_98,&local_b0,true);
  if (local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  llbuild::buildsystem::BuildValue::~BuildValue(&local_88);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    // A missing command always builds to an invalid value, and forces
    // downstream clients to be rebuilt (at which point they will presumably see
    // the command is no longer used).
    return ti.complete(BuildValue::makeInvalid().toData(),
                       /*forceChange=*/true);
  }